

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::Recycler::CleanupPendingUnroot(Recycler *this)

{
  undefined4 *puVar1;
  EntryType **ppEVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  GuestArenaAllocator *pGVar7;
  uint uVar8;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **ppSVar9;
  EntryType *current;
  ulong uVar10;
  undefined8 *in_FS_OFFSET;
  undefined1 local_40 [8];
  EditingIterator guestArenaIter;
  
  if (this->hasPendingConcurrentFindRoot == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1365,"(!this->hasPendingConcurrentFindRoot)",
                       "!this->hasPendingConcurrentFindRoot");
    if (!bVar4) goto LAB_0026a969;
    *puVar1 = 0;
  }
  if (this->hasPendingUnpinnedObject == true) {
    uVar8 = (this->pinnedObjectMap).size;
    if (uVar8 != 0) {
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      uVar10 = 0;
      do {
        ppEVar2 = (this->pinnedObjectMap).table;
        current = ppEVar2[uVar10];
        if (current != (EntryType *)0x0) {
          ppSVar9 = ppEVar2 + uVar10;
          do {
            uVar6 = (current->value).refCount;
            if ((uVar6 == 0) && ((current->value).stackBackTraces != (StackBackTraceNode *)0x0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar1 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                                 ,0x136c,"(refCount != 0 || refCount.stackBackTraces == nullptr)",
                                 "refCount != 0 || refCount.stackBackTraces == nullptr");
              if (!bVar4) goto LAB_0026a969;
              *puVar1 = 0;
              uVar6 = (current->value).refCount;
            }
            if (uVar6 == 0) {
              *ppSVar9 = current->next;
              SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
              ::FreeEntry(&this->pinnedObjectMap,current);
            }
            else {
              ppSVar9 = &current->next;
            }
            current = *ppSVar9;
          } while (current != (EntryType *)0x0);
          uVar8 = (this->pinnedObjectMap).size;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar8);
    }
    this->hasPendingUnpinnedObject = false;
  }
  local_40 = (undefined1  [8])&this->guestArenaList;
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  guestArenaIter.super_Iterator.list =
       (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)local_40;
  if (this->hasPendingDeleteGuestArena == true) {
    bVar4 = false;
    while( true ) {
      if (guestArenaIter.super_Iterator.list ==
          (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_0026a969;
        *puVar1 = 0;
      }
      guestArenaIter.super_Iterator.list =
           ((guestArenaIter.super_Iterator.list)->
           super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list;
      if ((undefined1  [8])guestArenaIter.super_Iterator.list == local_40) break;
      pGVar7 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_40);
      if (pGVar7->pendingDelete == true) {
        (pGVar7->super_ArenaAllocator).
        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.super_ArenaData.
        lockBlockList = false;
        DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::EditingIterator::
        RemoveCurrent<Memory::HeapAllocator>((EditingIterator *)local_40,&HeapAllocator::Instance);
        bVar4 = true;
      }
    }
    guestArenaIter.super_Iterator.list =
         (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
    this->hasPendingDeleteGuestArena = false;
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1383,"(foundPendingDelete)","foundPendingDelete");
      if (!bVar4) {
LAB_0026a969:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar1 = 0;
    }
  }
  else {
    while( true ) {
      if (guestArenaIter.super_Iterator.list ==
          (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                           ,0x66,"(current != nullptr)","current != nullptr");
        if (!bVar4) goto LAB_0026a969;
        *puVar1 = 0;
      }
      guestArenaIter.super_Iterator.list =
           ((guestArenaIter.super_Iterator.list)->
           super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list;
      if ((undefined1  [8])guestArenaIter.super_Iterator.list == local_40) break;
      pGVar7 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                         ((Iterator *)local_40);
      if (pGVar7->pendingDelete == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x138c,"(!allocator.pendingDelete)","!allocator.pendingDelete");
        if (!bVar4) goto LAB_0026a969;
        *puVar1 = 0;
      }
    }
  }
  return;
}

Assistant:

void
Recycler::CleanupPendingUnroot()
{
    Assert(!this->hasPendingConcurrentFindRoot);
    if (hasPendingUnpinnedObject)
    {
        pinnedObjectMap.MapAndRemoveIf([](void * obj, PinRecord const &refCount)
        {
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
            Assert(refCount != 0 || refCount.stackBackTraces == nullptr);
#endif
#endif
            return refCount == 0;
        });
        hasPendingUnpinnedObject = false;
    }

    if (hasPendingDeleteGuestArena)
    {
        DebugOnly(bool foundPendingDelete = false);
        DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
        while (guestArenaIter.Next())
        {
            GuestArenaAllocator& allocator = guestArenaIter.Data();
            if (allocator.pendingDelete)
            {
                allocator.SetLockBlockList(false);
                guestArenaIter.RemoveCurrent(&HeapAllocator::Instance);
                DebugOnly(foundPendingDelete = true);
            }
        }
        hasPendingDeleteGuestArena = false;
        Assert(foundPendingDelete);
    }
#if DBG
    else
    {
        DListBase<GuestArenaAllocator>::Iterator guestArenaIter(&guestArenaList);
        while (guestArenaIter.Next())
        {
            GuestArenaAllocator& allocator = guestArenaIter.Data();
            Assert(!allocator.pendingDelete);
        }
    }
#endif
}